

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::StringRealtoAMethod::eval
          (StringRealtoAMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  undefined1 uVar1;
  undefined1 uVar2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  ConstantValue *in_RDI;
  real_t this_00;
  string *str;
  ConstantValue valCv;
  LValue strCv;
  ConstantValue *in_stack_fffffffffffffd98;
  EvalContext *in_stack_fffffffffffffda0;
  undefined6 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdae;
  undefined1 in_stack_fffffffffffffdaf;
  real_t local_240 [10];
  undefined4 local_1f0;
  ConstantValue *in_stack_ffffffffffffff98;
  LValue *in_stack_ffffffffffffffa0;
  
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::evalLValue
            ((Expression *)
             CONCAT17(in_stack_fffffffffffffdaf,
                      CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
             in_stack_fffffffffffffda0);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,1);
  Expression::eval((Expression *)
                   CONCAT17(in_stack_fffffffffffffdaf,
                            CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),
                   in_stack_fffffffffffffda0);
  uVar1 = LValue::operator_cast_to_bool((LValue *)0xb20a6e);
  if (((bool)uVar1) &&
     (uVar2 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xb20a8b), (bool)uVar2))
  {
    this_00 = slang::ConstantValue::real(in_stack_fffffffffffffd98);
    local_240[0] = this_00;
    str = (string *)real_t::operator_cast_to_double(local_240);
    std::__cxx11::to_string((double)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffda8)));
    slang::ConstantValue::ConstantValue((ConstantValue *)this_00.v,str);
    LValue::store(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xb20b56);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00.v);
    slang::ConstantValue::ConstantValue((ConstantValue *)this_00.v,str);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  }
  local_1f0 = 1;
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xb20bc1);
  LValue::~LValue((LValue *)0xb20bce);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto strCv = args[0]->evalLValue(context);
        auto valCv = args[1]->eval(context);
        if (!strCv || !valCv)
            return nullptr;

        strCv.store(std::to_string(valCv.real()));
        return nullptr;
    }